

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_sse2.c
# Opt level: O3

void aom_highbd_quantize_b_sse2
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  int *piVar1;
  uint *puVar2;
  short sVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i zbins [2];
  uint local_98 [4];
  int local_88 [4];
  int local_78 [4];
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58 [4];
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  iVar6 = (int)count;
  iVar5 = iVar6 + 3;
  if (-1 < iVar6) {
    iVar5 = iVar6;
  }
  auVar15 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  local_78[0] = auVar15._0_4_ >> 0x10;
  local_78[1] = auVar15._4_4_ >> 0x10;
  local_58[0] = -local_78[0];
  local_58[1] = -local_78[1];
  local_58[2] = -local_78[1];
  local_58[3] = -local_78[1];
  local_48 = -local_78[1];
  iStack_44 = -local_78[1];
  iStack_40 = -local_78[1];
  iStack_3c = -local_78[1];
  local_78[2] = local_78[1];
  local_78[3] = local_78[1];
  local_68 = local_78[1];
  iStack_64 = local_78[1];
  iStack_60 = local_78[1];
  iStack_5c = local_78[1];
  memset(qcoeff_ptr,0,count * 4);
  memset(dqcoeff_ptr,0,count * 4);
  uVar9 = (iVar5 >> 2) * 4;
  uVar13 = iVar5 >> 2;
  do {
    uVar8 = uVar13;
    uVar9 = uVar9 - 4;
    if ((int)uVar8 < 1) {
      uVar4 = 0;
      goto LAB_0031e164;
    }
    uVar13 = uVar8 - 1;
    piVar1 = coeff_ptr + uVar9;
    uVar10 = (ulong)(uVar13 != 0);
    auVar16._0_4_ = -(uint)(*piVar1 < local_78[uVar10 * 4]);
    auVar16._4_4_ = -(uint)(piVar1[1] < local_78[uVar10 * 4 + 1]);
    auVar16._8_4_ = -(uint)(piVar1[2] < local_78[uVar10 * 4 + 2]);
    auVar16._12_4_ = -(uint)(piVar1[3] < local_78[uVar10 * 4 + 3]);
    auVar15._0_4_ = -(uint)(local_58[uVar10 * 4] < *piVar1);
    auVar15._4_4_ = -(uint)(local_58[uVar10 * 4 + 1] < piVar1[1]);
    auVar15._8_4_ = -(uint)(local_58[uVar10 * 4 + 2] < piVar1[2]);
    auVar15._12_4_ = -(uint)(local_58[uVar10 * 4 + 3] < piVar1[3]);
    iVar6 = movmskps((uint)(uVar13 != 0) << 4,auVar15 & auVar16);
  } while (iVar6 == 0xf);
  sVar3 = -1;
  lVar7 = 0;
  uVar10 = 0;
  do {
    puVar2 = (uint *)(coeff_ptr + uVar10 * 4);
    local_98[0] = (int)*puVar2 >> 0x1f;
    local_98[1] = (int)puVar2[1] >> 0x1f;
    local_98[2] = (int)puVar2[2] >> 0x1f;
    local_98[3] = (int)puVar2[3] >> 0x1f;
    local_88[0] = (*puVar2 ^ local_98[0]) - local_98[0];
    local_88[1] = (puVar2[1] ^ local_98[1]) - local_98[1];
    local_88[2] = (puVar2[2] ^ local_98[2]) - local_98[2];
    local_88[3] = (puVar2[3] ^ local_98[3]) - local_98[3];
    uVar12 = (ulong)(uVar10 != 0);
    auVar17._0_4_ = -(uint)(local_88[0] < local_78[uVar12 * 4]);
    auVar17._4_4_ = -(uint)(local_88[1] < local_78[uVar12 * 4 + 1]);
    auVar17._8_4_ = -(uint)(local_88[2] < local_78[uVar12 * 4 + 2]);
    auVar17._12_4_ = -(uint)(local_88[3] < local_78[uVar12 * 4 + 3]);
    uVar9 = 0;
    lVar11 = 0;
    do {
      if ((((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)((byte)(auVar17._12_4_ >> 7) & 1) << 0xc |
                     (ushort)((byte)(auVar17._12_4_ >> 0xf) & 1) << 0xd |
                     (ushort)((byte)(auVar17._12_4_ >> 0x17) & 1) << 0xe |
                    (ushort)(byte)(auVar17._12_4_ >> 0x1f) << 0xf) ^ 0xffff) >> (uVar9 & 0x1f) & 1)
          != 0) {
        uVar12 = (ulong)((uint)(lVar7 != lVar11) * 2);
        lVar14 = (long)*(short *)((long)round_ptr + uVar12) + (long)local_88[lVar11];
        uVar13 = (uint)((long)*(short *)((long)quant_shift_ptr + uVar12) *
                        (((ulong)(*(short *)((long)quant_ptr + uVar12) * lVar14) >> 0x10) + lVar14)
                       >> 0x10);
        iVar6 = (local_98[lVar11] ^ uVar13) - local_98[lVar11];
        qcoeff_ptr[lVar11] = iVar6;
        dqcoeff_ptr[lVar11] = *(short *)((long)dequant_ptr + uVar12) * iVar6;
        if (uVar13 != 0) {
          if (sVar3 <= iscan[lVar11]) {
            sVar3 = iscan[lVar11];
          }
        }
      }
      lVar11 = lVar11 + 1;
      uVar9 = uVar9 + 4;
    } while (lVar11 != 4);
    uVar10 = uVar10 + 1;
    iscan = iscan + 4;
    dqcoeff_ptr = dqcoeff_ptr + 4;
    qcoeff_ptr = qcoeff_ptr + 4;
    lVar7 = lVar7 + -4;
  } while (uVar10 != (uVar8 & 0x7fffffff));
  uVar4 = sVar3 + 1;
LAB_0031e164:
  *eob_ptr = uVar4;
  return;
}

Assistant:

void aom_highbd_quantize_b_sse2(const tran_low_t *coeff_ptr, intptr_t count,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  int i, j, non_zero_regs = (int)count / 4, eob_i = -1;
  __m128i zbins[2];
  __m128i nzbins[2];

  zbins[0] = _mm_set_epi32((int)zbin_ptr[1], (int)zbin_ptr[1], (int)zbin_ptr[1],
                           (int)zbin_ptr[0]);
  zbins[1] = _mm_set1_epi32((int)zbin_ptr[1]);

  nzbins[0] = _mm_setzero_si128();
  nzbins[1] = _mm_setzero_si128();
  nzbins[0] = _mm_sub_epi32(nzbins[0], zbins[0]);
  nzbins[1] = _mm_sub_epi32(nzbins[1], zbins[1]);

  (void)scan;

  memset(qcoeff_ptr, 0, count * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, count * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = ((int)count / 4) - 1; i >= 0; i--) {
    __m128i coeffs, cmp1, cmp2;
    int test;
    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    cmp1 = _mm_cmplt_epi32(coeffs, zbins[i != 0]);
    cmp2 = _mm_cmpgt_epi32(coeffs, nzbins[i != 0]);
    cmp1 = _mm_and_si128(cmp1, cmp2);
    test = _mm_movemask_epi8(cmp1);
    if (test == 0xffff)
      non_zero_regs--;
    else
      break;
  }

  // Quantization pass:
  for (i = 0; i < non_zero_regs; i++) {
    __m128i coeffs, coeffs_sign, tmp1, tmp2;
    int test;
    int abs_coeff[4];
    int coeff_sign[4];

    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    coeffs_sign = _mm_srai_epi32(coeffs, 31);
    coeffs = _mm_sub_epi32(_mm_xor_si128(coeffs, coeffs_sign), coeffs_sign);
    tmp1 = _mm_cmpgt_epi32(coeffs, zbins[i != 0]);
    tmp2 = _mm_cmpeq_epi32(coeffs, zbins[i != 0]);
    tmp1 = _mm_or_si128(tmp1, tmp2);
    test = _mm_movemask_epi8(tmp1);
    _mm_storeu_si128((__m128i *)abs_coeff, coeffs);
    _mm_storeu_si128((__m128i *)coeff_sign, coeffs_sign);

    for (j = 0; j < 4; j++) {
      if (test & (1 << (4 * j))) {
        int k = 4 * i + j;
        const int64_t tmp3 = abs_coeff[j] + round_ptr[k != 0];
        const int64_t tmp4 = ((tmp3 * quant_ptr[k != 0]) >> 16) + tmp3;
        const uint32_t abs_qcoeff =
            (uint32_t)((tmp4 * quant_shift_ptr[k != 0]) >> 16);
        qcoeff_ptr[k] =
            (int)(abs_qcoeff ^ (uint32_t)coeff_sign[j]) - coeff_sign[j];
        dqcoeff_ptr[k] = qcoeff_ptr[k] * dequant_ptr[k != 0];
        if (abs_qcoeff) eob_i = iscan[k] > eob_i ? iscan[k] : eob_i;
      }
    }
  }
  *eob_ptr = eob_i + 1;
}